

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_collective.cpp
# Opt level: O0

void __thiscall
MxxColl_GathervGeneral_Test::~MxxColl_GathervGeneral_Test(MxxColl_GathervGeneral_Test *this)

{
  MxxColl_GathervGeneral_Test *this_local;
  
  ~MxxColl_GathervGeneral_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(MxxColl, GathervGeneral) {
    mxx::comm c;
    std::vector<size_t> recv_sizes;
    // fill elements
    size_t size = 5*(c.rank()+2);
    std::vector<int> els(size);
    for (size_t i = 0; i < size; ++i) {
        els[i] = c.rank()*13 - 42*i;
    }
    std::vector<int> all;
    size_t total_size = 0;
    if (c.rank() == 0) {
        // prepare recv sizes and output vector
        recv_sizes.resize(c.size());
        for (int i = 0; i < c.size(); ++i) {
            recv_sizes[i] = 5*(i+2);
            total_size += recv_sizes[i];
        }
        all.resize(total_size);
    }

    // general gatherv
    mxx::gatherv(&els[0], size, &all[0], recv_sizes, 0, c);
    if (c.rank() == 0) {
        size_t pos = 0;
        for (int i = 0; i < c.size(); ++i) {
            for (int j = 0; j < (5*(i+2)); ++j) {
                ASSERT_EQ(i*13 - 42*j, all[pos++]);
            }
        }
    }
    // convenience functions
    all = mxx::gatherv(&els[0], size, recv_sizes, 0, c);
    if (c.rank() == 0) {
        ASSERT_EQ(total_size, all.size());
        size_t pos = 0;
        for (int i = 0; i < c.size(); ++i) {
            for (int j = 0; j < (5*(i+2)); ++j) {
                ASSERT_EQ(i*13 - 42*j, all[pos++]);
            }
        }
    } else {
        ASSERT_EQ(0u, all.size());
    }
    // convenience functions
    all = mxx::gatherv(els, recv_sizes, 0);
    if (c.rank() == 0) {
        ASSERT_EQ(total_size, all.size());
        size_t pos = 0;
        for (int i = 0; i < c.size(); ++i) {
            for (int j = 0; j < (5*(i+2)); ++j) {
                ASSERT_EQ(i*13 - 42*j, all[pos++]);
            }
        }
    } else {
        ASSERT_EQ(0u, all.size());
    }
}